

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::UnserializeUInt(IMkvReader *pReader,longlong pos,longlong size)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long status;
  uchar b;
  longlong i;
  longlong result;
  byte local_31;
  long local_30;
  ulong local_28;
  long local_20;
  long local_18;
  undefined8 *local_10;
  ulong local_8;
  
  if ((((in_RDI == (undefined8 *)0x0) || (in_RSI < 0)) || (in_RDX < 1)) || (8 < in_RDX)) {
    local_8 = 0xfffffffffffffffe;
  }
  else {
    local_28 = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      iVar1 = (**(code **)*local_10)(local_10,local_18,1,&local_31);
      if ((long)iVar1 < 0) {
        return (long)iVar1;
      }
      local_28 = (ulong)local_31 | local_28 << 8;
      local_18 = local_18 + 1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

long long UnserializeUInt(IMkvReader* pReader, long long pos, long long size) {
  if (!pReader || pos < 0 || (size <= 0) || (size > 8))
    return E_FILE_FORMAT_INVALID;

  long long result = 0;

  for (long long i = 0; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}